

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::PosixWritableFile
          (PosixWritableFile *this,string *filename,int fd)

{
  bool bVar1;
  undefined4 in_EDX;
  string *in_RSI;
  string *in_RDI;
  string *filename_00;
  string *filename_01;
  
  filename_00 = in_RSI;
  filename_01 = in_RDI;
  WritableFile::WritableFile((WritableFile *)in_RDI);
  *(undefined ***)in_RDI = &PTR__PosixWritableFile_0012ca50;
  in_RDI[0x800]._M_string_length = 0;
  *(undefined4 *)&in_RDI[0x800].field_2 = in_EDX;
  bVar1 = IsManifest(filename_00);
  in_RDI[0x800].field_2._M_local_buf[4] = bVar1;
  std::__cxx11::string::string((string *)(in_RDI[0x800].field_2._M_local_buf + 8),(string *)in_RSI);
  Dirname(filename_01);
  return;
}

Assistant:

PosixWritableFile(std::string filename, int fd)
      : pos_(0),
        fd_(fd),
        is_manifest_(IsManifest(filename)),
        filename_(std::move(filename)),
        dirname_(Dirname(filename_)) {}